

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall cmCTestMultiProcessHandler::PrintOutputAsJson(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *pcVar1;
  ValueHolder testProperties;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  Value *pVVar6;
  string *value;
  _Base_ptr p_Var7;
  StreamWriter *pSVar8;
  _Rb_tree_color _Var9;
  ArrayIndex backtrace;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commandAndArgs;
  Value testInfo;
  Value result;
  Value tests;
  BacktraceData backtraceGraph;
  cmWorkingDirectory workdir;
  StreamWriterBuilder builder;
  UInt local_4e4;
  cmCTestMultiProcessHandler *local_4e0;
  ValueHolder local_4d8;
  undefined8 uStack_4d0;
  long local_4c8 [4];
  _Rb_tree_node_base *local_4a8;
  Value local_4a0;
  Value local_478;
  Value local_450;
  Value local_428;
  BacktraceData local_400;
  cmWorkingDirectory local_2e0;
  ValueHolder local_2b8 [3];
  cmCTest *local_2a0;
  int local_f8;
  value_type local_a0;
  long local_80;
  long local_78;
  
  pcVar1 = this->TestHandler;
  _Var9 = _S_red;
  local_4e0 = this;
  for (p_Var5 = (this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 !=
      &(this->Tests).
       super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if ((int)_Var9 < (int)p_Var5[1]._M_color) {
      _Var9 = p_Var5[1]._M_color;
    }
  }
  pcVar1->MaxIndex = _Var9;
  Json::Value::Value(&local_450,objectValue);
  Json::Value::Value((Value *)local_2b8,"ctestInfo");
  pVVar6 = Json::Value::operator[](&local_450,"kind");
  Json::Value::operator=(pVVar6,(Value *)local_2b8);
  Json::Value::~Value((Value *)local_2b8);
  Json::Value::Value((Value *)&local_400,objectValue);
  Json::Value::Value((Value *)local_2b8,1);
  pVVar6 = Json::Value::operator[]((Value *)&local_400,"major");
  Json::Value::operator=(pVVar6,(Value *)local_2b8);
  Json::Value::~Value((Value *)local_2b8);
  Json::Value::Value((Value *)local_2b8,0);
  pVVar6 = Json::Value::operator[]((Value *)&local_400,"minor");
  Json::Value::operator=(pVVar6,(Value *)local_2b8);
  Json::Value::~Value((Value *)local_2b8);
  pVVar6 = Json::Value::operator[](&local_450,"version");
  Json::Value::operator=(pVVar6,(Value *)&local_400);
  Json::Value::~Value((Value *)&local_400);
  BacktraceData::BacktraceData(&local_400);
  Json::Value::Value(&local_428,arrayValue);
  p_Var7 = (local_4e0->Properties).
           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4a8 = &(local_4e0->Properties).
               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var7 != local_4a8) {
    do {
      testProperties = (ValueHolder)p_Var7[1]._M_parent;
      cmWorkingDirectory::cmWorkingDirectory
                (&local_2e0,
                 (string *)
                 &((testProperties.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right);
      cmCTestRunTest::cmCTestRunTest((cmCTestRunTest *)local_2b8,local_4e0);
      local_f8 = *(int *)(testProperties.int_ + 0x170);
      local_2b8[0] = testProperties;
      cmCTestRunTest::ComputeArguments((cmCTestRunTest *)local_2b8);
      pbVar2 = (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(testProperties.int_ + 0x40))->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)*(pointer *)(testProperties.int_ + 0x48) - (long)pbVar2) < 0x21) {
LAB_00209b4c:
        Json::Value::Value(&local_4a0,objectValue);
        Json::Value::Value(&local_478,(String *)testProperties.map_);
        pVVar6 = Json::Value::operator[](&local_4a0,"name");
        Json::Value::operator=(pVVar6,&local_478);
        Json::Value::~Value(&local_478);
        value = cmCTest::GetConfigType_abi_cxx11_(local_2a0);
        if (value->_M_string_length != 0) {
          Json::Value::Value(&local_478,value);
          pVVar6 = Json::Value::operator[](&local_4a0,"config");
          Json::Value::operator=(pVVar6,&local_478);
          Json::Value::~Value(&local_478);
        }
        if (local_a0._M_string_length != 0) {
          local_4d8.int_ = 0;
          uStack_4d0 = 0;
          local_4c8[0] = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_4d8,&local_a0);
          if (local_80 != local_78) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_4d8,(local_78 - local_80 >> 5) + 1);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_4d8,uStack_4d0,local_80,local_78);
          }
          DumpToJsonArray(&local_478,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_4d8);
          pVVar6 = Json::Value::operator[](&local_4a0,"command");
          Json::Value::operator=(pVVar6,&local_478);
          Json::Value::~Value(&local_478);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_4d8);
        }
        DumpCTestProperties((Value *)&local_4d8,(cmCTestTestProperties *)testProperties.map_);
        bVar3 = Json::Value::empty((Value *)&local_4d8);
        if (!bVar3) {
          pVVar6 = Json::Value::operator[](&local_4a0,"properties");
          Json::Value::operator=(pVVar6,(Value *)&local_4d8);
        }
        bVar3 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                          ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)
                           (testProperties.int_ + 0x2f0));
        if (!bVar3) {
          bVar3 = BacktraceData::Add(&local_400,(cmListFileBacktrace *)(testProperties.int_ + 0x2f0)
                                     ,&local_4e4);
          if (bVar3) {
            Json::Value::Value(&local_478,local_4e4);
            pVVar6 = Json::Value::operator[](&local_4a0,"backtrace");
            Json::Value::operator=(pVVar6,&local_478);
            Json::Value::~Value(&local_478);
          }
        }
        Json::Value::~Value((Value *)&local_4d8);
        Json::Value::append(&local_428,&local_4a0);
        Json::Value::~Value(&local_4a0);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)(pbVar2 + 1));
        if (iVar4 != 0) goto LAB_00209b4c;
      }
      cmCTestRunTest::~cmCTestRunTest((cmCTestRunTest *)local_2b8);
      cmWorkingDirectory::~cmWorkingDirectory(&local_2e0);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_4a8);
  }
  BacktraceData::Dump((Value *)local_2b8,&local_400);
  pVVar6 = Json::Value::operator[](&local_450,"backtraceGraph");
  Json::Value::operator=(pVVar6,(Value *)local_2b8);
  Json::Value::~Value((Value *)local_2b8);
  pVVar6 = Json::Value::operator[](&local_450,"tests");
  Json::Value::operator=(pVVar6,&local_428);
  Json::StreamWriterBuilder::StreamWriterBuilder((StreamWriterBuilder *)local_2b8);
  Json::Value::Value(&local_478,"  ");
  local_4d8.string_ = (char *)local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"indentation","");
  pVVar6 = Json::StreamWriterBuilder::operator[]
                     ((StreamWriterBuilder *)local_2b8,(String *)&local_4d8);
  Json::Value::operator=(pVVar6,&local_478);
  if (local_4d8 != local_4c8) {
    operator_delete(local_4d8.string_,local_4c8[0] + 1);
  }
  Json::Value::~Value(&local_478);
  pSVar8 = Json::StreamWriterBuilder::newStreamWriter((StreamWriterBuilder *)local_2b8);
  (*pSVar8->_vptr_StreamWriter[2])(pSVar8,&local_450,&std::cout);
  (*pSVar8->_vptr_StreamWriter[1])(pSVar8);
  Json::StreamWriterBuilder::~StreamWriterBuilder((StreamWriterBuilder *)local_2b8);
  Json::Value::~Value(&local_428);
  Json::Value::~Value(&local_400.Nodes);
  Json::Value::~Value(&local_400.Files);
  Json::Value::~Value(&local_400.Commands);
  std::
  _Hashtable<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_400.NodeMap._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_400.FileMap._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_400);
  Json::Value::~Value(&local_450);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::PrintOutputAsJson()
{
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  Json::Value result = Json::objectValue;
  result["kind"] = "ctestInfo";
  result["version"] = DumpVersion(1, 0);

  BacktraceData backtraceGraph;
  Json::Value tests = Json::arrayValue;
  for (auto& it : this->Properties) {
    cmCTestTestHandler::cmCTestTestProperties& p = *it.second;

    // Don't worry if this fails, we are only showing the test list, not
    // running the tests
    cmWorkingDirectory workdir(p.Directory);
    cmCTestRunTest testRun(*this);
    testRun.SetIndex(p.Index);
    testRun.SetTestProperties(&p);
    testRun.ComputeArguments();

    // Skip tests not available in this configuration.
    if (p.Args.size() >= 2 && p.Args[1] == "NOT_AVAILABLE") {
      continue;
    }

    Json::Value testInfo = DumpCTestInfo(testRun, p, backtraceGraph);
    tests.append(testInfo);
  }
  result["backtraceGraph"] = backtraceGraph.Dump();
  result["tests"] = std::move(tests);

  Json::StreamWriterBuilder builder;
  builder["indentation"] = "  ";
  std::unique_ptr<Json::StreamWriter> jout(builder.newStreamWriter());
  jout->write(result, &std::cout);
}